

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O0

VarType * __thiscall
glu::
getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
          (VarType *__return_storage_ptr__,glu *this,VarType *type,
          __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
          begin,__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                end)

{
  bool bVar1;
  deBool dVar2;
  Precision precision_00;
  int vecSize;
  TestError *this_00;
  StructType *this_01;
  StructMember *this_02;
  pointer pVVar3;
  DataType local_5c;
  Precision precision;
  DataType basicType;
  __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  pathIter;
  VarType *curType;
  VarType *type_local;
  __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  end_local;
  __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  begin_local;
  
  type_local = (VarType *)begin._M_current;
  end_local._M_current = (VarTypeComponent *)type;
  do {
    dVar2 = ::deGetFalse();
    if ((dVar2 != 0) ||
       (bVar1 = isValidTypePath<__gnu_cxx::__normal_iterator<glu::VarTypeComponent*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                          ((VarType *)this,end_local,
                           (__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                            )type_local), !bVar1)) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"isValidTypePath(type, begin, end)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.hpp"
                 ,0x178);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  _precision = end_local._M_current;
  pathIter._M_current = (VarTypeComponent *)this;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                             *)&precision,
                            (__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                             *)&type_local), bVar1) {
    pVVar3 = __gnu_cxx::
             __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
             ::operator->((__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                           *)&precision);
    if (pVVar3->type == STRUCT_MEMBER) {
      this_01 = VarType::getStructPtr((VarType *)pathIter._M_current);
      pVVar3 = __gnu_cxx::
               __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator->((__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                             *)&precision);
      this_02 = StructType::getMember(this_01,pVVar3->index);
      pathIter._M_current = (VarTypeComponent *)StructMember::getType(this_02);
    }
    else {
      pVVar3 = __gnu_cxx::
               __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator->((__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                             *)&precision);
      if (pVVar3->type != ARRAY_ELEMENT) break;
      pathIter._M_current = (VarTypeComponent *)VarType::getElementType(pathIter._M_current);
    }
    __gnu_cxx::
    __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
    ::operator++((__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                  *)&precision);
  }
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      *)&precision,
                     (__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      *)&type_local);
  if (bVar1) {
    local_5c = VarType::getBasicType((VarType *)pathIter._M_current);
    precision_00 = VarType::getPrecision((VarType *)pathIter._M_current);
    pVVar3 = __gnu_cxx::
             __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
             ::operator->((__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                           *)&precision);
    if (pVVar3->type == MATRIX_COLUMN) {
      vecSize = getDataTypeMatrixNumRows(local_5c);
      local_5c = getDataTypeFloatVec(vecSize);
      __gnu_cxx::
      __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
      ::operator++((__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    *)&precision);
    }
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                        *)&precision,
                       (__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                        *)&type_local);
    if ((bVar1) &&
       (pVVar3 = __gnu_cxx::
                 __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                 ::operator->((__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                               *)&precision), pVVar3->type == VECTOR_COMPONENT)) {
      local_5c = getDataTypeScalarType(local_5c);
      __gnu_cxx::
      __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
      ::operator++((__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    *)&precision);
    }
    VarType::VarType(__return_storage_ptr__,local_5c,precision_00);
  }
  else {
    VarType::VarType(__return_storage_ptr__,(VarType *)pathIter._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

VarType getVarType (const VarType& type, Iterator begin, Iterator end)
{
	TCU_CHECK(isValidTypePath(type, begin, end));

	const VarType*	curType		= &type;
	Iterator		pathIter	= begin;

	// Process struct member and array element parts of path.
	while (pathIter != end)
	{
		if (pathIter->type == VarTypeComponent::STRUCT_MEMBER)
			curType = &curType->getStructPtr()->getMember(pathIter->index).getType();
		else if (pathIter->type == VarTypeComponent::ARRAY_ELEMENT)
			curType = &curType->getElementType();
		else
			break;

		++pathIter;
	}

	if (pathIter != end)
	{
		DataType	basicType	= curType->getBasicType();
		Precision	precision	= curType->getPrecision();

		if (pathIter->type == VarTypeComponent::MATRIX_COLUMN)
		{
			basicType = getDataTypeFloatVec(getDataTypeMatrixNumRows(basicType));
			++pathIter;
		}

		if (pathIter != end && pathIter->type == VarTypeComponent::VECTOR_COMPONENT)
		{
			basicType = getDataTypeScalarType(basicType);
			++pathIter;
		}

		DE_ASSERT(pathIter == end);
		return VarType(basicType, precision);
	}
	else
		return VarType(*curType);
}